

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

int Ppmd8_DecodeSymbol(CPpmd8 *p)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  Byte *pBVar4;
  UInt16 UVar5;
  uint j;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  CPpmd8_Context *pCVar10;
  CPpmd_See *pCVar11;
  CPpmd_State *pCVar12;
  CPpmd_State **ppCVar13;
  UInt32 UVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  UInt16 *pUVar18;
  byte *pbVar19;
  byte *pbVar20;
  UInt32 local_93c;
  size_t charMask [32];
  CPpmd_State *ps [256];
  
  pCVar10 = p->MinContext;
  uVar17 = (uint)pCVar10->NumStats;
  if (pCVar10->NumStats == 0) {
    pUVar18 = p->BinSumm[p->NS2Indx[(ulong)*(byte *)((long)&pCVar10->SummFreq + 1) - 1]] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) + (uint)pCVar10->Flags +
              (uint)p->NS2BSIndx[p->Base[pCVar10->Suffix]] + p->PrevSuccess);
    uVar17 = p->Range >> 0xe;
    p->Range = uVar17;
    uVar3 = *pUVar18;
    if (p->Code / uVar17 < (uint)uVar3) {
      RangeDec_Decode(p,0,(uint)uVar3);
      *pUVar18 = (*pUVar18 - (short)(*pUVar18 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&p->MinContext->SummFreq;
      UVar5 = p->MinContext->SummFreq;
      Ppmd8_UpdateBin(p);
      return (uint)(byte)UVar5;
    }
    RangeDec_Decode(p,(uint)uVar3,0x4000 - uVar3);
    uVar17 = (uint)*pUVar18 - (*pUVar18 + 0x20 >> 7);
    *pUVar18 = (ushort)uVar17;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar17 & 0xffff) >> 10];
    for (uVar9 = 0; uVar9 < 0x20; uVar9 = uVar9 + 8) {
      charMask[uVar9] = 0xffffffffffffffff;
      charMask[uVar9 + 1] = 0xffffffffffffffff;
      charMask[uVar9 + 2] = 0xffffffffffffffff;
      charMask[uVar9 + 3] = 0xffffffffffffffff;
      charMask[uVar9 + 4] = 0xffffffffffffffff;
      charMask[uVar9 + 5] = 0xffffffffffffffff;
      charMask[uVar9 + 6] = 0xffffffffffffffff;
      charMask[uVar9 + 7] = 0xffffffffffffffff;
    }
    pCVar10 = p->MinContext;
    *(undefined1 *)((long)charMask + (ulong)(byte)pCVar10->SummFreq) = 0;
    p->PrevSuccess = 0;
  }
  else {
    pBVar4 = p->Base;
    uVar16 = (ulong)pCVar10->Stats;
    uVar3 = pCVar10->SummFreq;
    uVar9 = (ulong)p->Range / (ulong)uVar3;
    p->Range = (UInt32)uVar9;
    bVar1 = pBVar4[uVar16 + 1];
    uVar6 = (uint)(p->Code / uVar9);
    if (uVar6 < bVar1) {
      RangeDec_Decode(p,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar4 + uVar16);
      bVar1 = ((CPpmd_State *)(pBVar4 + uVar16))->Symbol;
      Ppmd8_Update1_0(p);
      return (uint)bVar1;
    }
    p->PrevSuccess = 0;
    pbVar20 = pBVar4 + (uVar16 - 6);
    uVar15 = (uint)bVar1;
    do {
      pbVar19 = pbVar20;
      UVar14 = uVar15 + pbVar19[0xd];
      if (uVar6 < UVar14) {
        RangeDec_Decode(p,uVar15,(uint)pbVar19[0xd]);
        p->FoundState = (CPpmd_State *)(pbVar19 + 0xc);
        bVar1 = pbVar19[0xc];
        Ppmd8_Update1(p);
        return (uint)bVar1;
      }
      pbVar20 = pbVar19 + 6;
      uVar17 = uVar17 - 1;
      uVar15 = UVar14;
    } while (uVar17 != 0);
    if (uVar3 <= uVar6) {
      return -2;
    }
    RangeDec_Decode(p,UVar14,uVar3 - UVar14);
    for (uVar9 = 0; uVar9 < 0x20; uVar9 = uVar9 + 8) {
      charMask[uVar9] = 0xffffffffffffffff;
      charMask[uVar9 + 1] = 0xffffffffffffffff;
      charMask[uVar9 + 2] = 0xffffffffffffffff;
      charMask[uVar9 + 3] = 0xffffffffffffffff;
      charMask[uVar9 + 4] = 0xffffffffffffffff;
      charMask[uVar9 + 5] = 0xffffffffffffffff;
      charMask[uVar9 + 6] = 0xffffffffffffffff;
      charMask[uVar9 + 7] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + (ulong)pbVar19[0xc]) = 0;
    pCVar10 = p->MinContext;
    uVar17 = (uint)pCVar10->NumStats;
    do {
      *(undefined1 *)((long)charMask + (ulong)*pbVar20) = 0;
      pbVar20 = pbVar20 + -6;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  while( true ) {
    bVar1 = pCVar10->NumStats;
    uVar17 = p->OrderFall;
    do {
      uVar9 = (ulong)pCVar10->Suffix;
      if (uVar9 == 0) {
        p->OrderFall = uVar17 + 1;
        return -1;
      }
      pBVar4 = p->Base;
      pCVar10 = (CPpmd8_Context *)(pBVar4 + uVar9);
      p->MinContext = pCVar10;
      bVar2 = pBVar4[uVar9];
      uVar17 = uVar17 + 1;
    } while (bVar2 == bVar1);
    p->OrderFall = uVar17;
    pCVar12 = (CPpmd_State *)(pBVar4 + pCVar10->Stats);
    uVar6 = (uint)bVar1;
    uVar17 = 0;
    uVar9 = 0;
    do {
      uVar15 = (uint)*(char *)((long)charMask + (ulong)pCVar12->Symbol);
      uVar17 = uVar17 + (pCVar12->Freq & uVar15);
      ps[uVar9] = pCVar12;
      pCVar12 = pCVar12 + 1;
      uVar15 = (int)uVar9 - uVar15;
      uVar9 = (ulong)uVar15;
    } while (uVar15 != bVar2 - uVar6);
    pCVar11 = Ppmd8_MakeEscFreq(p,uVar6,&local_93c);
    uVar15 = local_93c + uVar17;
    uVar9 = (ulong)p->Range / (ulong)uVar15;
    p->Range = (UInt32)uVar9;
    uVar7 = (uint)(p->Code / uVar9);
    if (uVar7 < uVar17) break;
    if (uVar15 <= uVar7) {
      return -2;
    }
    RangeDec_Decode(p,uVar17,local_93c);
    pCVar11->Summ = pCVar11->Summ + (short)uVar15;
    iVar8 = uVar6 - bVar2;
    ppCVar13 = ps + (~uVar6 + (uint)bVar2);
    do {
      *(undefined1 *)((long)charMask + (ulong)(*ppCVar13)->Symbol) = 0;
      ppCVar13 = ppCVar13 + -1;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
    pCVar10 = p->MinContext;
  }
  ppCVar13 = ps;
  uVar17 = 0;
  do {
    UVar14 = uVar17;
    pCVar12 = *ppCVar13;
    uVar17 = UVar14 + pCVar12->Freq;
    ppCVar13 = ppCVar13 + 1;
  } while (uVar17 <= uVar7);
  RangeDec_Decode(p,UVar14,(uint)pCVar12->Freq);
  bVar1 = pCVar11->Shift;
  if (bVar1 < 7) {
    pBVar4 = &pCVar11->Count;
    *pBVar4 = *pBVar4 + 0xff;
    if (*pBVar4 == '\0') {
      pCVar11->Summ = pCVar11->Summ << 1;
      pCVar11->Shift = bVar1 + 1;
      pCVar11->Count = (Byte)(3 << (bVar1 & 0x1f));
    }
  }
  p->FoundState = pCVar12;
  bVar1 = pCVar12->Symbol;
  Ppmd8_Update2(p);
  return (uint)bVar1;
}

Assistant:

int Ppmd8_DecodeSymbol(CPpmd8 *p)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 0)
  {
    CPpmd_State *s = Ppmd8_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = RangeDec_GetThreshold(p, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd8_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    RangeDec_Decode(p, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd8_GetBinSumm(p);
    if (((p->Code / (p->Range >>= 14)) < *prob))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd8Context_OneState(p->MinContext))->Symbol;
      Ppmd8_UpdateBin(p);
      return symbol;
    }
    RangeDec_Decode(p, *prob, (1 << 14) - *prob);
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD8_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd8Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd8_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd8_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd8_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = RangeDec_GetThreshold(p, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    RangeDec_Decode(p, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}